

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecontext.cpp
# Opt level: O3

void __thiscall FParseContext::ParseLump(FParseContext *this,char *lumpname)

{
  int iVar1;
  char *pcVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  char *dest;
  long lVar6;
  FParseToken *pFVar7;
  double *pdVar8;
  byte bVar9;
  char *sourcep;
  FParseToken token;
  FParseToken in_stack_ffffffffffffff18;
  char *local_88;
  FParseToken local_80;
  
  bVar9 = 0;
  iVar1 = this->SourceLine;
  pcVar2 = this->SourceFile;
  iVar4 = FWadCollection::CheckNumForFullName(&Wads,lumpname,true,0);
  if (iVar4 == -1) {
    Printf("%s, line %d: Lump \'%s\' not found\n",this->SourceFile,(ulong)(uint)this->SourceLine,
           lumpname);
    return;
  }
  iVar5 = FWadCollection::LumpLength(&Wads,iVar4);
  dest = (char *)operator_new__((long)(iVar5 + 1));
  FWadCollection::ReadLump(&Wads,iVar4,dest);
  dest[iVar5] = '\0';
  this->SourceLine = 0;
  this->SourceFile = lumpname;
  local_88 = dest;
  iVar4 = GetToken(this,&local_88,&local_80);
  if (iVar4 != 0) {
    do {
      if (iVar4 == this->TokenTrans[0x1a]) {
        iVar4 = GetToken(this,&local_88,&local_80);
        if (iVar4 != this->TokenTrans[0x19]) {
          Printf("%s, line %d: Include: String parameter expected\n",this->SourceFile,
                 (ulong)(uint)this->SourceLine);
          return;
        }
        ParseLump(this,local_80.sym);
      }
      else {
        pvVar3 = this->pParser;
        pFVar7 = &local_80;
        pdVar8 = (double *)&stack0xffffffffffffff18;
        for (lVar6 = 10; lVar6 != 0; lVar6 = lVar6 + -1) {
          *pdVar8 = pFVar7->fval;
          pFVar7 = (FParseToken *)((long)pFVar7 + (ulong)bVar9 * -0x10 + 8);
          pdVar8 = pdVar8 + (ulong)bVar9 * -2 + 1;
        }
        (*this->Parse)(pvVar3,iVar4,in_stack_ffffffffffffff18,this);
      }
      iVar4 = GetToken(this,&local_88,&local_80);
    } while (iVar4 != 0);
  }
  operator_delete__(dest);
  this->SourceLine = iVar1;
  this->SourceFile = pcVar2;
  return;
}

Assistant:

void FParseContext::ParseLump(const char *lumpname)
{
	int tokentype;
	int SavedSourceLine = SourceLine;
	const char *SavedSourceFile = SourceFile;
	FParseToken token;

	int lumpno = Wads.CheckNumForFullName(lumpname, true);

	if (lumpno == -1) 
	{
		Printf ("%s, line %d: Lump '%s' not found\n", SourceFile, SourceLine, lumpname);
		return;
	}

	// Read the lump into a buffer and add a 0-terminator
	int lumplen = Wads.LumpLength(lumpno);
	char *lumpdata = new char[lumplen+1];
	Wads.ReadLump(lumpno, lumpdata);
	lumpdata[lumplen] = 0;

	SourceLine = 0;
	SourceFile = lumpname;

	char *sourcep = lumpdata;
	while ( (tokentype = GetToken(sourcep, &token)) )
	{
		// It is much easier to handle include statements outside the main parser.
		if (tokentype == TokenTrans[INCLUDE])
		{
			if (GetToken(sourcep, &token) != TokenTrans[STRING])
			{
				Printf("%s, line %d: Include: String parameter expected\n", SourceFile, SourceLine);
				return;
			}
			ParseLump(token.string);
		}
		else
		{
			Parse(pParser, tokentype, token, this);
		}
	}
	delete [] lumpdata;
	SourceLine = SavedSourceLine;
	SourceFile = SavedSourceFile;
}